

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tqapi_cs.cpp
# Opt level: O1

CallResultWrap * tapi_query(void *h,char *account_id,char *command,char *data)

{
  CallResultWrap *pCVar1;
  CallResult<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> r;
  allocator local_ab;
  allocator local_aa;
  allocator local_a9;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  string *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  string local_38;
  
  if (h != (void *)0x0) {
    std::__cxx11::string::string((string *)local_68,account_id,&local_a9);
    std::__cxx11::string::string((string *)local_88,command,&local_aa);
    std::__cxx11::string::string((string *)local_a8,data,&local_ab);
    (**(code **)(*h + 0x68))(&local_48,h,local_68,local_88,local_a8);
    if (local_a8[0] != local_98) {
      operator_delete(local_a8[0]);
    }
    if (local_88[0] != local_78) {
      operator_delete(local_88[0]);
    }
    if (local_68[0] != local_58) {
      operator_delete(local_68[0]);
    }
    pCVar1 = (CallResultWrap *)operator_new(0x10c);
    *(undefined8 *)((long)&pCVar1->value + 4) = 0;
    pCVar1->element_count = 0;
    pCVar1->value_type = 0;
    pCVar1->msg = (char *)0x0;
    pCVar1->value = (void *)0x0;
    (pCVar1->_msg)._M_dataplus._M_p = (pointer)&(pCVar1->_msg).field_2;
    (pCVar1->_msg)._M_string_length = 0;
    (pCVar1->_msg).field_2._M_local_buf[0] = '\0';
    (pCVar1->text)._M_dataplus._M_p = (pointer)&(pCVar1->text).field_2;
    (pCVar1->text)._M_string_length = 0;
    (pCVar1->text).field_2._M_local_buf[0] = '\0';
    memset(&pCVar1->bars,0,0xb0);
    if (local_48 == (string *)0x0) {
      utf8_to_utf16(&local_38,&pCVar1->_msg);
      pCVar1->msg = (pCVar1->_msg)._M_dataplus._M_p;
    }
    else {
      utf8_to_utf16(local_48,&pCVar1->text);
      pCVar1->value = (pCVar1->text)._M_dataplus._M_p;
      pCVar1->value_type = 5;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
    }
    return pCVar1;
  }
  __assert_fail("tapi",
                "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/c/api/tqapi_cs.cpp"
                ,0x1b7,
                "CallResultWrap *tapi_query(void *, const char *, const char *, const char *)");
}

Assistant:

_TQAPI_EXPORT
CallResultWrap* tapi_query(void* h, const char* account_id, const char* command, const char* data)
{
    auto tapi = reinterpret_cast<TradeApi*>(h);
    assert(tapi);

    auto r = tapi->query(account_id, command, data);
    CallResultWrap* cr = new CallResultWrap();
    if (r.value) {
		cr->value = _T(*r.value, cr->text);
        cr->value_type = VT_STRING;
    }
    else {
        cr->msg = _T(r.msg, cr->_msg);
    }
    return cr;
}